

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O1

void __thiscall Memory::RecyclerSweepManager::StartPartialCollectMode(RecyclerSweepManager *this)

{
  Recycler *pRVar1;
  undefined4 *puVar2;
  ulong uVar3;
  code *pcVar4;
  bool bVar5;
  ulong uVar6;
  undefined8 *in_FS_OFFSET;
  
  pRVar1 = this->recycler;
  bVar5 = pRVar1->inPartialCollectMode;
  this->inPartialCollect = bVar5;
  pRVar1->inPartialCollectMode = true;
  if ((pRVar1->partialUncollectedAllocBytes != 0) && (bVar5 == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x159,
                       "(recycler->partialUncollectedAllocBytes == 0 || this->inPartialCollect)",
                       "recycler->partialUncollectedAllocBytes == 0 || this->inPartialCollect");
    if (!bVar5) goto LAB_0028b3b4;
    *puVar2 = 0;
  }
  uVar3 = this->recycler->partialUncollectedAllocBytes;
  this->lastPartialUncollectedAllocBytes = uVar3;
  uVar6 = (this->recycler->autoHeap).uncollectedAllocBytes;
  if (uVar6 < uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x15d,
                       "(currentUncollectedAllocBytes >= this->lastPartialUncollectedAllocBytes)",
                       "currentUncollectedAllocBytes >= this->lastPartialUncollectedAllocBytes");
    if (!bVar5) {
LAB_0028b3b4:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  if (this->inPartialCollect == false) {
    uVar6 = uVar6 + (this->recycler->autoHeap).lastUncollectedAllocBytes;
  }
  pRVar1 = this->recycler;
  pRVar1->partialUncollectedAllocBytes = uVar6;
  this->nextPartialUncollectedAllocBytes = uVar6;
  bVar5 = Js::Phases::IsEnabled(&pRVar1->recyclerFlagsTable->Trace,PartialCollectPhase);
  if (bVar5) {
    Output::Print(L"StartPartialCollectMode\n");
    Output::Print(L"  was inPartialCollectMode = %d\n",(ulong)this->inPartialCollect);
    Output::Print(L"  lastPartialUncollectedAllocBytes = %d\n",
                  this->lastPartialUncollectedAllocBytes);
    Output::Print(L"  uncollectedAllocBytes = %d\n",(this->recycler->autoHeap).uncollectedAllocBytes
                 );
    Output::Print(L"  nextPartialUncollectedAllocBytes = %d\n",
                  this->nextPartialUncollectedAllocBytes);
    return;
  }
  return;
}

Assistant:

void
RecyclerSweepManager::StartPartialCollectMode()
{
    // Save the in partial collect, the main thread reset it after returning to the script
    // and the background thread still needs it
    this->inPartialCollect = recycler->inPartialCollectMode;
    recycler->inPartialCollectMode = true;

    // Tracks the unallocated alloc bytes for partial GC

    // Keep a copy Last collection's uncollected allocation bytes, so we can use it to calculate
    // the new object that is allocated since the last GC
    Assert(recycler->partialUncollectedAllocBytes == 0 || this->inPartialCollect);
    this->lastPartialUncollectedAllocBytes = recycler->partialUncollectedAllocBytes;

    size_t currentUncollectedAllocBytes = recycler->autoHeap.uncollectedAllocBytes;
    Assert(currentUncollectedAllocBytes >= this->lastPartialUncollectedAllocBytes);

    if (!this->inPartialCollect)
    {
        // If we did a full collect, then we need to include lastUncollectedAllocBytes
        // in the partialUncollectedAllocBytes calculation, because all objects allocated
        // since the previous GC are considered new, but we cleared uncollectedAllocBytes
        // when we kicked off the GC.
        currentUncollectedAllocBytes += recycler->autoHeap.lastUncollectedAllocBytes;
    }

    // Initially, the partial uncollected alloc bytes is the current uncollectedAllocBytes
    recycler->partialUncollectedAllocBytes = currentUncollectedAllocBytes;
    this->nextPartialUncollectedAllocBytes = currentUncollectedAllocBytes;

#ifdef RECYCLER_TRACE
    if (recycler->GetRecyclerFlagsTable().Trace.IsEnabled(Js::PartialCollectPhase))
    {
        Output::Print(_u("StartPartialCollectMode\n"));
        Output::Print(_u("  was inPartialCollectMode = %d\n"), this->inPartialCollect);
        Output::Print(_u("  lastPartialUncollectedAllocBytes = %d\n"), this->lastPartialUncollectedAllocBytes);
        Output::Print(_u("  uncollectedAllocBytes = %d\n"), recycler->autoHeap.uncollectedAllocBytes);
        Output::Print(_u("  nextPartialUncollectedAllocBytes = %d\n"), this->nextPartialUncollectedAllocBytes);
    }
#endif
}